

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O3

void login_log(CHAR_DATA *ch,int type)

{
  time_t tVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char query [4608];
  
  pcVar5 = ch->pcdata->host;
  if (pcVar5 == (char *)0x0) {
    if (ch->desc == (DESCRIPTOR_DATA *)0x0) {
      return;
    }
    if ((ch->comm[0] & 0x8000000) != 0) {
      return;
    }
    pcVar5 = ch->desc->host;
  }
  else if ((ch->comm[0] & 0x8000000) != 0) {
    return;
  }
  pcVar3 = escape_string(pcVar5);
  pcVar5 = ch->true_name;
  pcVar4 = log_time();
  tVar1 = current_time;
  if (type == 2) {
    lVar8 = (current_time - ch->logon) / 0x3c;
  }
  else {
    lVar8 = -1;
    if (type < 1) {
      uVar7 = 0xffffffff;
      uVar6 = 0xffffffff;
      goto LAB_0023df12;
    }
  }
  uVar2 = count_carried(ch,false);
  uVar7 = (ulong)uVar2;
  uVar2 = count_carried(ch,true);
  uVar6 = (ulong)uVar2;
LAB_0023df12:
  sprintf(query,
          "INSERT INTO logins VALUES(\'%s\', \'%s\', \'%s\', \'%ld\', \'%ld\', \'%d\', \'%d\', \'%d\')"
          ,pcVar5,pcVar3,pcVar4,tVar1,lVar8,uVar7,uVar6,type);
  one_query(query);
  return;
}

Assistant:

void login_log(CHAR_DATA *ch, int type)
{
	if (!ch->pcdata->host && !ch->desc)
		return;

	if (IS_SET(ch->comm, COMM_NOSOCKET))
		return;

	auto escape = ch->pcdata->host
					  ? escape_string(ch->pcdata->host)
					  : escape_string(ch->desc->host);

	char query[MAX_STRING_LENGTH];
	sprintf(query, "INSERT INTO logins VALUES('%s', '%s', '%s', '%ld', '%ld', '%d', '%d', '%d')",
			ch->true_name,
			escape,
			log_time(),
			current_time,
			type == 2 ? ((current_time - ch->logon) / 60) : -1,
			type > 0 ? count_carried(ch, false) : -1, type > 0 ? count_carried(ch, true) : -1,
			type);

	one_query(query);
}